

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_json_relation.cpp
# Opt level: O2

void __thiscall
duckdb::ReadJSONRelation::ReadJSONRelation
          (ReadJSONRelation *this,shared_ptr<duckdb::ClientContext,_true> *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *input,named_parameter_map_t *options,bool auto_detect,string *alias_p)

{
  char *pcVar1;
  undefined7 in_register_00000081;
  initializer_list<duckdb::Value> __l;
  allocator_type local_fa;
  allocator local_f9;
  shared_ptr<duckdb::Relation,_true> local_f8;
  vector<duckdb::Value,_true> local_e0;
  string local_c8;
  Value local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  pcVar1 = "read_json";
  if ((int)CONCAT71(in_register_00000081,auto_detect) != 0) {
    pcVar1 = "read_json_auto";
  }
  ::std::__cxx11::string::string((string *)&local_c8,pcVar1,&local_f9);
  MultiFileReader::CreateValueFromFileList(&local_a8,input);
  __l._M_len = 1;
  __l._M_array = &local_a8;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e0,__l,&local_fa);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_68,&options->_M_h);
  local_f8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_f8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  TableFunctionRelation::TableFunctionRelation
            (&this->super_TableFunctionRelation,context,&local_c8,&local_e0,
             (named_parameter_map_t *)&local_68,&local_f8,true);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e0);
  Value::~Value(&local_a8);
  ::std::__cxx11::string::~string((string *)&local_c8);
  (this->super_TableFunctionRelation).super_Relation._vptr_Relation =
       (_func_int **)&PTR__ReadJSONRelation_027ba090;
  (this->json_file)._M_dataplus._M_p = (pointer)&(this->json_file).field_2;
  (this->json_file)._M_string_length = 0;
  (this->json_file).field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&this->alias,(string *)alias_p);
  InitializeAlias(this,input);
  return;
}

Assistant:

ReadJSONRelation::ReadJSONRelation(const shared_ptr<ClientContext> &context, vector<string> &input,
                                   named_parameter_map_t options, bool auto_detect, string alias_p)
    : TableFunctionRelation(context, auto_detect ? "read_json_auto" : "read_json",
                            {MultiFileReader::CreateValueFromFileList(input)}, std::move(options)),
      alias(std::move(alias_p)) {

	InitializeAlias(input);
}